

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_preprocessAndSolveReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool applySimplifier,bool *interrupt)

{
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  byte in_SIL;
  time_t *__timer;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  Real remainingTime;
  bool keepbounds;
  Result simplificationStatus;
  bool *in_stack_000001d8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000001e0;
  bool copyLP;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd68;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  byte bVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd80;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  undefined8 in_stack_fffffffffffffda8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **in_stack_fffffffffffffdb0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  undefined6 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  Real local_208;
  undefined1 local_200 [64];
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe40;
  undefined1 local_1b0 [80];
  double local_160;
  byte local_155;
  int local_154;
  undefined1 local_150 [76];
  Result in_stack_fffffffffffffefc;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff00;
  undefined1 local_f4 [83];
  byte local_a1;
  Real local_a0;
  byte local_89;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  Real *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_89 = in_SIL & 1;
  pSVar10 = &in_RDI->_solver;
  local_a0 = realParam(in_RDI,OBJ_OFFSET);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeObjOffset<double>(in_stack_fffffffffffffd68,(double *)0x610f6c);
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[3])();
  in_RDI->_applyPolishing = false;
  if ((local_89 & 1) == 0) {
    _disableSimplifierAndScaler(in_RDI);
    local_230 = in_stack_ffffffffffffff00;
  }
  else {
    _enableSimplifierAndScaler(in_stack_fffffffffffffe40);
    local_230 = in_stack_ffffffffffffff00;
  }
  bVar8 = 1;
  if ((in_RDI->_simplifier ==
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0) &&
     (in_stack_fffffffffffffde6 = 0, bVar8 = in_stack_fffffffffffffde6,
     in_RDI->_scaler !=
     (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *)0x0)) {
    in_stack_fffffffffffffde6 = in_RDI->_isRealLPScaled ^ 0xff;
    bVar8 = in_stack_fffffffffffffde6;
  }
  local_a1 = bVar8 & 1;
  bVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::isTerminationValueEnabled(&in_RDI->_solver);
  if (bVar2) {
    iVar3 = intParam(in_RDI,OBJSENSE);
    if (iVar3 == -1) {
      local_230 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)realParam(in_RDI,OBJLIMIT_UPPER);
    }
    else {
      local_230 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)realParam(in_RDI,OBJLIMIT_LOWER);
    }
    local_70 = local_f4;
    local_78 = &stack0xffffffffffffff00;
    local_80 = 0;
    local_48 = local_78;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd80,
               (double)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationValue
              (in_stack_fffffffffffffd70,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffd68);
  }
  else {
    local_60 = infinity();
    local_58 = local_150;
    local_68 = 0;
    local_50 = local_60;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd80,
               (double)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationValue
              (in_stack_fffffffffffffd70,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffd68);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::toggleTerminationValue(&in_RDI->_solver,true);
  }
  if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
    bVar2 = SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0);
    if ((in_RDI->_hasBasis & 1U) == 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(in_stack_fffffffffffffd80,
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),bVar2);
    }
    else {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(in_stack_fffffffffffffd80,
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),bVar2);
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::get_const_ptr(&in_RDI->_basisStatusRows);
      DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
      ::get_const_ptr(&in_RDI->_basisStatusCols);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasis((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI,(VarStatus *)pSVar10,
                 (VarStatus *)
                 CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
    }
    if ((local_a1 & 1) == 0) {
      (**(in_RDI->_realLP->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .
         super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._vptr_ClassArray)();
      spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)0x6112e8);
      in_RDI->_realLP =
           &(in_RDI->_solver).
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      in_RDI->_isRealLPLoaded = true;
    }
  }
  else if ((local_a1 & 1) != 0) {
    in_RDI->_realLP =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (in_stack_fffffffffffffdb0,iVar4);
    pSVar1 = in_RDI->_realLP;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(&in_stack_fffffffffffffd80->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    in_RDI->_realLP = pSVar1;
    in_RDI->_isRealLPLoaded = false;
  }
  local_154 = 0;
  if (in_RDI->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) goto LAB_0061161f;
  iVar4 = intParam(in_RDI,RATIOTESTER);
  local_155 = iVar4 == 3;
  iVar4 = intParam(in_RDI,REPRESENTATION);
  if (iVar4 == 2) {
LAB_006113ef:
    __timer = (time_t *)0x8;
    bVar2 = boolParam(in_RDI,ROWBOUNDFLIPS);
    local_155 = (local_155 & 1 & bVar2) != 0;
  }
  else {
    __timer = (time_t *)0x1;
    iVar4 = intParam(in_RDI,REPRESENTATION);
    if (iVar4 == 0) {
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x611396);
      __timer = (time_t *)0x10;
      RVar6 = realParam(in_RDI,REPRESENTATION_SWITCH);
      dVar7 = (double)(iVar4 + 1) * RVar6;
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x6113dc);
      if (dVar7 < (double)(iVar4 + 1)) goto LAB_006113ef;
    }
  }
  in_stack_fffffffffffffd70 =
       (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getMaxTime(&in_RDI->_solver);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::time(&in_RDI->_solver,__timer);
  dVar7 = (double)in_stack_fffffffffffffd70 - extraout_XMM0_Qa;
  pSVar9 = in_RDI->_simplifier;
  pSVar10 = &in_RDI->_solver;
  bVar8 = local_155;
  local_160 = dVar7;
  uVar5 = Random::getSeed(&(in_RDI->_solver).random);
  local_154 = (*pSVar9->_vptr_SPxSimplifier[5])
                        (dVar7,pSVar9,pSVar10,(ulong)(bVar8 & 1),(ulong)uVar5);
  (*in_RDI->_simplifier->_vptr_SPxSimplifier[0x10])(local_200);
  local_208 = realParam(in_RDI,OBJ_OFFSET);
  local_28 = local_1b0;
  local_30 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_200;
  local_38 = &local_208;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30);
  local_20 = local_1b0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd70);
  local_10 = local_1b0;
  local_18 = local_30;
  local_8 = local_38;
  boost::multiprecision::default_ops::
  eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd70,
             (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd68,(double *)0x6115da);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  changeObjOffset<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&in_stack_fffffffffffffd70->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_fffffffffffffd68);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setScalingInfo(&(in_RDI->_solver).
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,false);
  in_RDI->_applyPolishing = true;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setSolutionPolishing(&in_RDI->_solver,POLISH_OFF);
LAB_0061161f:
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (local_154 == 0) {
    if ((in_RDI->_scaler !=
         (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0) &&
       (bVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isScaled(&(in_RDI->_solver).
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ), !bVar2)) {
      (*in_RDI->_scaler->_vptr_SPxScaler[0xd])(in_RDI->_scaler,&in_RDI->_solver,0);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidateBasis(in_stack_fffffffffffffd70);
    }
    _solveRealLPAndRecordStatistics(in_stack_000001e0,in_stack_000001d8);
  }
  _evaluateSolutionReal(local_230,in_stack_fffffffffffffefc);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}